

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

bool mkvparser::Match(IMkvReader *pReader,longlong *pos,unsigned_long expected_id,uchar **buf,
                     size_t *buflen)

{
  int iVar1;
  unsigned_long uVar2;
  ulong uVar3;
  uchar *puVar4;
  long lVar5;
  longlong available;
  long len;
  longlong total;
  long local_40;
  long local_38;
  
  if ((pReader != (IMkvReader *)0x0) && (-1 < *pos)) {
    local_38 = 0;
    iVar1 = (*pReader->_vptr_IMkvReader[1])();
    if ((-1 < iVar1) && ((local_38 < 0 || (-1 < local_38)))) {
      local_40 = 0;
      uVar2 = ReadID(pReader,*pos,&local_40);
      if (-1 < (long)uVar2) {
        if (uVar2 != expected_id) {
          return false;
        }
        if (local_40 < -*pos) {
          return false;
        }
        lVar5 = local_40 + *pos;
        *pos = lVar5;
        uVar3 = ReadUInt(pReader,lVar5,&local_40);
        if (((0xfffffffffffffff7 < local_40 - 9U && -1 < (long)uVar3) && (-*pos <= local_40)) &&
           (lVar5 = *pos + local_40, -1 < lVar5)) {
          *pos = lVar5;
          if (uVar3 == 0x7fffffffffffffff) {
            return false;
          }
          if ((long)(lVar5 + uVar3) < 0) {
            return false;
          }
          if (0 < (long)(lVar5 + uVar3)) {
            return false;
          }
          if (uVar3 - 0x80000001 < 0xffffffff80000000) {
            *buf = (uchar *)0x0;
          }
          else {
            puVar4 = (uchar *)operator_new__(uVar3,(nothrow_t *)&std::nothrow);
            *buf = puVar4;
            if ((puVar4 != (uchar *)0x0) &&
               (iVar1 = (**pReader->_vptr_IMkvReader)(pReader,lVar5,uVar3,puVar4), iVar1 == 0)) {
              *buflen = uVar3;
              *pos = *pos + uVar3;
              return true;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool Match(IMkvReader* pReader, long long& pos, unsigned long expected_id,
           unsigned char*& buf, size_t& buflen) {
  if (!pReader || pos < 0)
    return false;

  long long total = 0;
  long long available = 0;

  long status = pReader->Length(&total, &available);
  if (status < 0 || (total >= 0 && available > total))
    return false;

  long len = 0;
  const long long id = ReadID(pReader, pos, len);
  if (id < 0 || (available - pos) > len)
    return false;

  if (static_cast<unsigned long>(id) != expected_id)
    return false;

  pos += len;  // consume id

  const long long size = ReadUInt(pReader, pos, len);
  if (size < 0 || len <= 0 || len > 8 || (available - pos) > len)
    return false;

  unsigned long long rollover_check =
      static_cast<unsigned long long>(pos) + len;
  if (rollover_check > LLONG_MAX)
    return false;

  pos += len;  // consume length of size of payload

  rollover_check = static_cast<unsigned long long>(pos) + size;
  if (rollover_check > LLONG_MAX)
    return false;

  if ((pos + size) > available)
    return false;

  if (size >= LONG_MAX)
    return false;

  const long buflen_ = static_cast<long>(size);

  buf = SafeArrayAlloc<unsigned char>(1, buflen_);
  if (!buf)
    return false;

  status = pReader->Read(pos, buflen_, buf);
  if (status != 0)
    return false;

  buflen = buflen_;

  pos += size;  // consume size of payload
  return true;
}